

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Functions.c
# Opt level: O0

uint Jupiter_strtoui_nospace(char *str,int base)

{
  uchar uVar1;
  uint uVar2;
  int iVar3;
  uchar *puVar4;
  uint local_20;
  int tval;
  uint total;
  int base_local;
  char *str_local;
  
  local_20 = 0;
  if (*str == '-') {
    uVar2 = Jupiter_strtoi_nospace(str,base);
    return uVar2;
  }
  _total = (uchar *)str;
  if (*str == '+') {
    _total = (uchar *)(str + 1);
  }
  puVar4 = _total;
  if (base != 0) {
    tval = base;
    if (((base == 0x10) && (*_total == '0')) &&
       ((puVar4 = _total + 1, *puVar4 == 'x' || (*puVar4 == 'X')))) {
      puVar4 = _total + 2;
    }
    goto LAB_00194274;
  }
  if (*_total != '0') {
    tval = 10;
    goto LAB_00194274;
  }
  uVar1 = _total[1];
  if (uVar1 == 'B') {
LAB_00194203:
    tval = 2;
    puVar4 = _total + 2;
  }
  else {
    if (uVar1 != 'X') {
      if (uVar1 == 'b') goto LAB_00194203;
      if (uVar1 != 'x') {
        tval = 8;
        puVar4 = _total + 1;
        goto LAB_00194274;
      }
    }
    tval = 0x10;
    puVar4 = _total + 2;
  }
LAB_00194274:
  while (_total = puVar4, iVar3 = Jupiter_getBase(*_total,tval), iVar3 != -1) {
    local_20 = tval * local_20 + iVar3;
    puVar4 = _total + 1;
  }
  return local_20;
}

Assistant:

unsigned int Jupiter_strtoui_nospace(const char *str, int base)
{
	unsigned int total = 0;
	int tval;

	if (*str == '-')
		return Jupiter_strtoi_nospace(str, base);

	if (*str == '+')
		++str;

	if (base == 0) // Guess a base.
	{
		if (*str == '0')
		{
			switch (*++str)
			{
			case 'X':
			case 'x':
				++str;
				base = 16;
				break;
			case 'B':
			case 'b':
				++str;
				base = 2;
				break;
			default:
				base = 8;
				break;
			}
		}
		else base = 10;
	}
	else if (base == 16) // check for optional preceeding hexadecimal prefix.
	{
		if (*str == '0')
		{
			++str;
			if (*str == 'x' || *str == 'X')
				++str;
		}
	}

	while ((tval = Jupiter_getBase(*str, base)) != -1)
	{
		total = base * total + tval;
		++str;
	}

	return total;
}